

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::Stack<Lib::SmartPtr<Kernel::ApplicativeArgsIt>_>::~Stack
          (Stack<Lib::SmartPtr<Kernel::ApplicativeArgsIt>_> *this)

{
  ApplicativeArgsIt *pAVar1;
  RefCounter *pRVar2;
  void **head;
  ulong uVar3;
  SmartPtr<Kernel::ApplicativeArgsIt> *pSVar4;
  SmartPtr<Kernel::ApplicativeArgsIt> *pSVar5;
  
  pSVar4 = this->_stack;
  pSVar5 = this->_cursor;
  if (pSVar5 != pSVar4) {
    do {
      pAVar1 = pSVar5[-1]._obj;
      if (((pAVar1 != (ApplicativeArgsIt *)0x0) &&
          (pRVar2 = pSVar5[-1]._refCnt, pRVar2 != (RefCounter *)0x0)) &&
         (pRVar2->_val = pRVar2->_val + -1, pRVar2->_val == 0)) {
        (*(pAVar1->super_IteratorCore<Kernel::TermList>)._vptr_IteratorCore[1])();
        pRVar2 = pSVar5[-1]._refCnt;
        if (pRVar2 != (RefCounter *)0x0) {
          *(undefined8 *)pRVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pRVar2;
        }
      }
      pSVar5 = pSVar5 + -1;
      pSVar4 = this->_stack;
    } while (pSVar5 != pSVar4);
  }
  if (pSVar4 != (SmartPtr<Kernel::ApplicativeArgsIt> *)0x0) {
    uVar3 = this->_capacity << 4;
    if (uVar3 == 0) {
      pSVar4->_obj = (ApplicativeArgsIt *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pSVar4;
    }
    else if (uVar3 < 0x11) {
      pSVar4->_obj = (ApplicativeArgsIt *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pSVar4;
    }
    else if (uVar3 < 0x19) {
      pSVar4->_obj = (ApplicativeArgsIt *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pSVar4;
    }
    else if (uVar3 < 0x21) {
      pSVar4->_obj = (ApplicativeArgsIt *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pSVar4;
    }
    else if (uVar3 < 0x31) {
      pSVar4->_obj = (ApplicativeArgsIt *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pSVar4;
    }
    else {
      if (0x40 < uVar3) {
        operator_delete(pSVar4,0x10);
        return;
      }
      pSVar4->_obj = (ApplicativeArgsIt *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pSVar4;
    }
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }